

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

char * cmGetFilenamePath(char *name)

{
  char *pcVar1;
  string sres;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
  cmsys::SystemTools::GetFilenamePath(&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar1 = strdup(local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  return pcVar1;
}

Assistant:

char* CCONV cmGetFilenamePath(const char* name)
{
  std::string sres = cmSystemTools::GetFilenamePath(name);
  return strdup(sres.c_str());
}